

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o2.cc
# Opt level: O3

MatrixXd * __thiscall
lf::geometry::QuadO2::Global(MatrixXd *__return_storage_ptr__,QuadO2 *this,MatrixXd *local)

{
  undefined1 auVar1 [16];
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *dst;
  runtime_error *this_00;
  undefined8 *puVar2;
  double *pdVar3;
  long lVar4;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *pCVar5;
  bool bVar6;
  RhsNested *pRVar7;
  long lVar8;
  double dVar9;
  long lVar10;
  long lVar11;
  ActualDstType actualDst;
  byte bVar12;
  SquareReturnType local_squared;
  stringstream ss;
  scalar_sum_op<double,_double> local_711;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_710;
  Rhs local_708;
  Lhs local_700;
  Rhs local_6f0;
  Lhs local_6d8;
  Rhs local_6c0;
  undefined1 local_6b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a0;
  LhsNested local_690;
  XprTypeNested XStack_688;
  LhsNested local_670;
  undefined8 local_668 [16];
  LhsNested local_5e8;
  XprTypeNested local_5d8;
  RhsNested local_5c8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>
  local_5b0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>_>,_0>_>
  local_4f0;
  Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>
  local_3f0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>
  local_3d8;
  undefined1 local_3a8 [16];
  ostream local_398 [8];
  scalar_constant_op<double> local_390;
  RhsNested local_388;
  MatrixTypeNested local_2a0;
  variable_if_dynamic<long,__1> local_290;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>
  local_218;
  Rhs local_1f0;
  Rhs local_1c8;
  Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>_>,_0>
  local_148;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_118;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_e0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_a8;
  
  bVar12 = 0;
  local_4f0._0_8_ = (pointer)0x0;
  local_710 = &__return_storage_ptr__->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
  local_1c8.m_lhs = (LhsNested)local;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)local_6b0,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(scalar_constant_op<double> *)&local_4f0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)local_3a8,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)local_6b0,(Rhs *)&local_1c8,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)&local_4f0);
  lVar4 = ((local_388.m_expression)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar4) {
    pdVar3 = ((local_388.m_expression)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar11 = ((local_388.m_expression)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    bVar6 = false;
    lVar8 = 0;
    do {
      if (0 < lVar11) {
        lVar10 = 0;
        do {
          if (pdVar3[lVar10] < local_390.m_other) goto LAB_0024fb19;
          lVar10 = lVar10 + 1;
        } while (lVar11 != lVar10);
      }
      lVar8 = lVar8 + 1;
      pdVar3 = pdVar3 + lVar11;
      bVar6 = lVar4 <= lVar8;
    } while (lVar8 != lVar4);
LAB_0024fb19:
    if (!bVar6) goto LAB_0024fe4f;
  }
  local_5b0._0_8_ = &DAT_3ff0000000000000;
  local_a8.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = (PointerType)local;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)&local_4f0,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows,
                   (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_cols,(scalar_constant_op<double> *)&local_5b0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
                   *)local_6b0,(Lhs *)&local_a8,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)&local_4f0,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)&local_5b0);
  if (0 < (long)local_6a0._M_allocated_capacity) {
    lVar4 = *(long *)local_6b0._0_8_;
    bVar6 = false;
    dVar9 = 0.0;
    do {
      if (0 < (long)local_6b0._8_8_) {
        lVar11 = 0;
        do {
          if ((double)local_6a0._8_8_ < *(double *)(lVar4 + lVar11 * 8)) goto LAB_0024fbca;
          lVar11 = lVar11 + 1;
        } while (local_6b0._8_8_ != lVar11);
      }
      dVar9 = (double)((long)dVar9 + 1);
      lVar4 = lVar4 + *(Index *)(local_6b0._0_8_ + 8) * 8;
      bVar6 = (long)local_6a0._M_allocated_capacity <= (long)dVar9;
    } while (dVar9 != (double)local_6a0._M_allocated_capacity);
LAB_0024fbca:
    if (!bVar6) {
LAB_0024fe4f:
      std::__cxx11::stringstream::stringstream((stringstream *)local_3a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_398,"local coordinates out of bounds for reference element",0x35);
      local_6b0._0_8_ = &local_6a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b0,"(0. <= local.array()).all() && (local.array() <= 1.).all()",""
                );
      local_4f0._0_8_ = (long)&local_4f0 + 0x10U;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_6b0,(string *)&local_4f0,0x3a,(string *)&local_5b0);
      if (local_5b0._0_8_ != (long)&local_5b0 + 0x10U) {
        operator_delete((void *)local_5b0._0_8_,(ulong)((long)local_5b0.m_lhs.m_lhs.m_rhs + 1));
      }
      if (local_4f0._0_8_ != (long)&local_4f0 + 0x10U) {
        operator_delete((void *)local_4f0._0_8_,(long)local_4f0.m_lhs.m_lhs.m_lhs.m_lhs + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b0._0_8_ != &local_6a0) {
        operator_delete((void *)local_6b0._0_8_,local_6a0._M_allocated_capacity + 1);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  local_700.m_xpr.m_expression = local;
  Eigen::
  Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
  Product((Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
           *)local_3a8,&this->beta_,local);
  local_6d8.m_lhs = (LhsNested)local_3a8._0_8_;
  local_6d8.m_rhs = (RhsNested)local_3a8._8_8_;
  local_6c0.m_expression.m_xpr.m_expression = local;
  Eigen::
  Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_0>
  ::Product(&local_3f0,&this->gamma_,&local_6c0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_0>_>
  ::CwiseBinaryOp(&local_3d8,&local_6d8,&local_3f0,(scalar_sum_op<double,_double> *)local_3a8);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            (&local_e0,local,0);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            (&local_118,local,1);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
  ::CwiseBinaryOp(&local_a8,&local_e0,&local_118,(scalar_product_op<double,_double> *)local_3a8);
  local_1c8.m_lhs = &this->delta_;
  pCVar5 = &local_a8;
  pRVar7 = &local_1c8.m_rhs;
  for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pRVar7->m_lhs).
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
    m_data = (pCVar5->m_lhs).
             super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
             .m_data;
    pCVar5 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)((long)pCVar5 + (ulong)bVar12 * -0x10 + 8);
    pRVar7 = (RhsNested *)((long)pRVar7 + ((ulong)bVar12 * -2 + 1) * 8);
  }
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_0>_>
  ::CwiseBinaryOp(&local_5b0,&local_3d8,&local_1c8,(scalar_sum_op<double,_double> *)local_3a8);
  local_708.m_expression.m_matrix = (NestedExpressionType)(NestedExpressionType)local;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>_>
  ::CwiseBinaryOp(&local_218,&local_700,&local_708,(scalar_product_op<double,_double> *)local_3a8);
  local_1f0.m_expression.m_lhs.m_xpr.m_expression = local_218.m_lhs.m_xpr.m_expression;
  local_1f0.m_expression.m_rhs.m_expression.m_matrix = local_218.m_rhs.m_expression.m_matrix;
  Eigen::
  Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>_>_>,_0>
  ::Product(&local_148,&this->epsilon_,&local_1f0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>_>_>,_0>_>
  ::CwiseBinaryOp(&local_4f0,&local_5b0,&local_148,(scalar_sum_op<double,_double> *)local_3a8);
  local_6a0._M_allocated_capacity = (size_type)local_4f0.m_lhs.m_lhs.m_lhs.m_lhs;
  local_6a0._8_8_ = local_4f0.m_lhs.m_lhs.m_lhs.m_rhs;
  local_690 = local_4f0.m_lhs.m_lhs.m_rhs.m_lhs;
  XStack_688.m_expression = local_4f0.m_lhs.m_lhs.m_rhs.m_rhs.m_expression.m_xpr.m_expression;
  local_670 = local_4f0.m_lhs.m_rhs.m_lhs;
  lVar4 = (long)&local_4f0 + 0x48;
  puVar2 = local_668;
  for (lVar11 = 0xe; lVar11 != 0; lVar11 = lVar11 + -1) {
    *puVar2 = *(undefined8 *)lVar4;
    lVar4 = lVar4 + ((ulong)bVar12 * -2 + 1) * 8;
    puVar2 = puVar2 + (ulong)bVar12 * -2 + 1;
  }
  local_5e8 = local_4f0.m_rhs.m_lhs;
  local_5d8.m_expression = local_4f0.m_rhs.m_rhs.m_expression.m_lhs.m_xpr.m_expression;
  local_5c8.m_expression.m_matrix = local_4f0.m_rhs.m_rhs.m_expression.m_rhs.m_expression.m_matrix;
  local_6f0.m_matrix = &this->alpha_;
  local_6f0.m_colFactor.m_value =
       *(Index *)((long)local_4f0.m_rhs.m_rhs.m_expression.m_rhs.m_expression.m_matrix + 0x10);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>_>_>,_0>_>,_const_Eigen::Replicate<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_-1>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>_>,_0>_>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>
                   *)local_3a8,(Lhs *)local_6b0,&local_6f0,&local_711);
  dst = local_710;
  (local_710->m_storage).m_data = (double *)0x0;
  (local_710->m_storage).m_rows = 0;
  (local_710->m_storage).m_cols = 0;
  lVar4 = (local_2a0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  if ((local_290.m_value != 0 && lVar4 != 0) &&
     (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar1 / SEXT816(local_290.m_value),0) < lVar4)) {
    puVar2 = (undefined8 *)
             __cxa_allocate_exception(8,lVar4,SUB168(auVar1 % SEXT816(local_290.m_value),0));
    *puVar2 = &std::out_of_range::vtable;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (local_710,lVar4,local_290.m_value);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>,0>const>const,Eigen::Product<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>,0>const>const,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::ArrayWrapper<Eigen::Reverse<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0>const>const>const>,0>const>const,Eigen::Replicate<Eigen::Matrix<double,_1,1,0,_1,1>,1,_1>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)dst,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_square_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Reverse<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>_>,_0>_>,_const_Eigen::Replicate<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,__1>_>
              *)local_3a8,(assign_op<double,_double> *)&local_6f0);
  return (MatrixXd *)dst;
}

Assistant:

Eigen::MatrixXd QuadO2::Global(const Eigen::MatrixXd& local) const {
  LF_VERIFY_MSG((0. <= local.array()).all() && (local.array() <= 1.).all(),
                "local coordinates out of bounds for reference element");

  auto local_squared = local.array().square();
  return ((beta_ * local) + (gamma_ * local_squared.matrix()) +
          (delta_ * local.row(0).cwiseProduct(local.row(1))) +
          (epsilon_ *
           (local_squared * local.colwise().reverse().array()).matrix()))
             .colwise() +
         alpha_;
}